

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManElaBestMatchOne
               (Nf_Man_t *p,int iObj,int c,int *pCut,int *pCutSet,Nf_Mat_t *pRes,int Required)

{
  float fVar1;
  Vec_Wec_t *p_00;
  Mio_Cell2_t *pMVar2;
  int iVar3;
  Vec_Int_t *p_01;
  ulong uVar4;
  word wVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  Nf_Mat_t Mb;
  Nf_Obj_t *pBestF [6];
  Nf_Mat_t local_98;
  Nf_Mat_t *local_88;
  int local_80;
  uint local_7c;
  int *local_78;
  int *local_70;
  long alStack_68 [7];
  
  uVar8 = *pCut;
  uVar11 = uVar8 & 0x1f;
  uVar7 = uVar8 >> 5;
  local_88 = pRes;
  local_80 = iObj;
  local_78 = pCutSet;
  local_7c = Abc_LitIsCompl(uVar7);
  p_00 = p->vTt2Match;
  iVar3 = Abc_Lit2Var(uVar7);
  p_01 = Vec_WecEntry(p_00,iVar3);
  for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
    alStack_68[uVar4] = (long)(p->pNfObjs + pCut[uVar4 + 1]);
  }
  local_98._0_4_ = 0;
  local_98.Cfg = (Nf_Cfg_t)0x0;
  local_98.D = 0;
  local_98.F = 0.0;
  if (uVar11 == 0) {
    if (0x3f < uVar8) {
      __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0x6f4,
                    "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                   );
    }
    uVar8 = (uint)(uVar7 == 1) ^ c;
    fVar1 = p->pCells[(int)uVar8].AreaF;
    local_98.F = fVar1;
    uVar7 = Nf_CutHandle(local_78,pCut);
    if ((fVar1 + 0.001 < local_88->F) || ((fVar1 + -0.001 < local_88->F && (0 < local_88->D)))) {
      *(uint *)local_88 = (uVar7 & 0x3ff) * 0x100000 + (uVar8 & 0xfffff) + -0x80000000;
      local_88->Cfg = (Nf_Cfg_t)(int)((ulong)(uint)local_98.D << 0x20);
      local_88->D = (int)(((ulong)(uint)local_98.D << 0x20) >> 0x20);
      local_88->F = local_98.F;
    }
  }
  else {
    local_70 = pCut;
    for (uVar8 = 0; (int)(uVar8 | 1) < p_01->nSize; uVar8 = uVar8 + 2) {
      iVar3 = Vec_IntEntry(p_01,uVar8);
      uVar7 = Vec_IntEntry(p_01,uVar8 | 1);
      pMVar2 = p->pCells;
      if (uVar11 != *(uint *)&pMVar2[iVar3].field_0x10 >> 0x1c) {
        __assert_fail("nFans == (int)pC->nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                      ,0x708,
                      "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                     );
      }
      if ((uVar7 & 1 ^ local_7c) == c) {
        bVar6 = 0;
        uVar4 = 0;
        uVar12 = 0;
        do {
          if (uVar11 == uVar4) {
            local_98.F = 3.4028235e+38;
            local_98.D = uVar12;
            uVar9 = Nf_CutHandle(local_78,local_70);
            local_98._0_4_ =
                 (uVar9 & 0x3ff) * 0x100000 + (*(uint *)&pMVar2[iVar3].field_0x10 & 0xfffff) +
                 -0x80000000;
            local_98.Cfg = (Nf_Cfg_t)(uVar7 & 0xfffffffe);
            wVar5 = Nf_MatchRefArea(p,local_80,c,&local_98,Required);
            local_98.F = (float)(int)wVar5 / 1000.0;
            if ((local_98.F + 0.001 < local_88->F) ||
               ((local_98.F + -0.001 < local_88->F && ((int)uVar12 < local_88->D)))) {
              *(ulong *)local_88 = CONCAT44(local_98.Cfg,local_98._0_4_);
              local_88->D = local_98.D;
              local_88->F = local_98.F;
            }
            break;
          }
          lVar10 = (ulong)(((uVar7 >> 1 & 0x7f) >> ((uint)uVar4 & 0x1f) & 1) != 0) * 0x20;
          if (-1 < *(int *)(alStack_68[(uVar7 >> 8) >> (bVar6 & 0x1f) & 0xf] + lVar10)) {
            __assert_fail("pMd->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                          ,0x70e,
                          "void Nf_ManElaBestMatchOne(Nf_Man_t *, int, int, int *, int *, Nf_Mat_t *, int)"
                         );
          }
          uVar9 = pMVar2[iVar3].iDelays[uVar4] +
                  *(int *)(alStack_68[(uVar7 >> 8) >> (bVar6 & 0x1f) & 0xf] + lVar10 + 8);
          if ((int)uVar12 <= (int)uVar9) {
            uVar12 = uVar9;
          }
          uVar4 = uVar4 + 1;
          bVar6 = bVar6 + 4;
        } while ((int)uVar12 <= Required);
      }
    }
  }
  return;
}

Assistant:

void Nf_ManElaBestMatchOne( Nf_Man_t * p, int iObj, int c, int * pCut, int * pCutSet, Nf_Mat_t * pRes, int Required )
{
    Nf_Mat_t Mb,*pMb = &Mb, * pMd;
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, Info, Offset, iFanin, fComplF;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // consider matches of this function
    memset( pMb, 0, sizeof(Nf_Mat_t) );
    pMb->D = SCL_INFINITY; pMb->F = FLT_MAX;
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        //printf( "Node %d(%d) is const\n", iObj, c );
        assert( iFuncLit == 0 || iFuncLit == 1 );
        pMb->D = 0;
        pMb->F = p->pCells[c ^ Const].AreaF;
        pMb->CutH = Nf_CutHandle(pCutSet, pCut);
        pMb->Gate = c ^ Const;
//        pMb->Conf = 0;
        pMb->Cfg = Nf_Int2Cfg(0);
        pMb->fBest = 1;
        // compare
        if ( pRes->F > pMb->F + NF_EPSILON || (pRes->F > pMb->F - NF_EPSILON && pRes->D > pMb->D) )
            *pRes = *pMb;
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        int Delay      = 0;
        assert( nFans == (int)pC->nFanins );
        if ( fCompl != c )
            continue;
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            pMd     = &pBestF[iFanin]->M[fComplF][0];
            assert( pMd->fBest );
            Delay = Abc_MaxInt( Delay, pMd->D + pC->iDelays[k] );
            if ( Delay > Required )
                break;
        }
        if ( k < nFans )
            continue;
        // create match
        pMb->D = Delay;
        pMb->F = FLT_MAX;
        pMb->fBest = 1;
        pMb->fCompl = 0;
        pMb->CutH = Nf_CutHandle(pCutSet, pCut);
        pMb->Gate = pC->Id;
        pMb->Cfg = Cfg;
        pMb->Cfg.fCompl = 0;
        // compute area
        pMb->F = Scl_Int2Flt((int)Nf_MatchRefArea(p, iObj, c, pMb, Required));
        // compare
        if ( pRes->F > pMb->F + NF_EPSILON || (pRes->F > pMb->F - NF_EPSILON && pRes->D > pMb->D) )
            *pRes = *pMb;
    }
}